

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::setText(QTextEdit *this,QString *text)

{
  long lVar1;
  uint uVar2;
  QString *in_RSI;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  TextFormat format;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAnyStringView::QAnyStringView(in_RDI,in_RSI);
  uVar2 = Qt::mightBeRichText(local_18);
  bVar3 = (uVar2 & 1) != 0;
  if (bVar3) {
    setHtml((QTextEdit *)(ulong)CONCAT14(bVar3,in_stack_ffffffffffffffd0),(QString *)in_RDI);
  }
  else {
    setPlainText((QTextEdit *)(ulong)CONCAT14(bVar3,in_stack_ffffffffffffffd0),(QString *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEdit::setText(const QString &text)
{
    Qt::TextFormat format = Qt::mightBeRichText(text) ? Qt::RichText : Qt::PlainText;
#ifndef QT_NO_TEXTHTMLPARSER
    if (format == Qt::RichText)
        setHtml(text);
    else
#else
    Q_UNUSED(format);
#endif
        setPlainText(text);
}